

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ProceduralAssignStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ProceduralAssignStatement,slang::ast::Expression_const&,bool&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,bool *args_1,SourceRange *args_2)

{
  ProceduralAssignStatement *this_00;
  SourceRange *args_local_2;
  bool *args_local_1;
  Expression *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ProceduralAssignStatement *)allocate(this,0x30,8);
  ast::ProceduralAssignStatement::ProceduralAssignStatement
            (this_00,args,(bool)(*args_1 & 1),*args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }